

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttDef.hpp
# Opt level: O1

bool __thiscall
xercesc_4_0::TraverseSchema::wildcardAllowsNamespace
          (TraverseSchema *this,SchemaAttDef *wildCard,uint nameURI)

{
  AttTypes AVar1;
  ulong uVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  AVar1 = (wildCard->super_XMLAttDef).fType;
  bVar6 = true;
  if (AVar1 != Any_Any) {
    if (AVar1 == Any_List) {
      uVar2 = wildCard->fNamespaceList->fCurCount;
      bVar6 = uVar2 != 0;
      if (bVar6) {
        puVar3 = wildCard->fNamespaceList->fElemList;
        if (*puVar3 == nameURI) {
          return true;
        }
        uVar4 = 1;
        do {
          uVar5 = uVar4;
          if (uVar2 == uVar5) break;
          uVar4 = uVar5 + 1;
        } while (puVar3[uVar5] != nameURI);
        bVar6 = uVar5 < uVar2;
      }
      if (bVar6) {
        return true;
      }
    }
    else if (((AVar1 == Any_Other) && (this->fEmptyNamespaceURI != nameURI)) &&
            (wildCard->fAttName->fURIId != nameURI)) {
      return true;
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

inline XMLAttDef::AttTypes XMLAttDef::getType() const
{
    return fType;
}